

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t unistrTextExtract(UText *t,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                         UErrorCode *pErrorCode)

{
  int32_t _length;
  int32_t start_00;
  UnicodeString *this;
  UBool UVar1;
  int local_74;
  int32_t local_70;
  Char16Ptr local_60;
  int32_t local_58;
  int local_54;
  int32_t trimmedLength;
  int32_t limit32;
  int32_t start32;
  int32_t length;
  UnicodeString *us;
  UErrorCode *pErrorCode_local;
  UChar *pUStack_30;
  int32_t destCapacity_local;
  UChar *dest_local;
  int64_t limit_local;
  int64_t start_local;
  UText *t_local;
  
  _start32 = (UnicodeString *)t->context;
  us = (UnicodeString *)pErrorCode;
  pErrorCode_local._4_4_ = destCapacity;
  pUStack_30 = dest;
  dest_local = (UChar *)limit;
  limit_local = start;
  start_local = (int64_t)t;
  limit32 = icu_63::UnicodeString::length(_start32);
  UVar1 = U_FAILURE(*(UErrorCode *)&(us->super_Replaceable).super_UObject._vptr_UObject);
  if (UVar1 == '\0') {
    if ((pErrorCode_local._4_4_ < 0) ||
       ((pUStack_30 == (UChar *)0x0 && (0 < pErrorCode_local._4_4_)))) {
      *(undefined4 *)&(us->super_Replaceable).super_UObject._vptr_UObject = 1;
    }
    if ((limit_local < 0) || ((long)dest_local < limit_local)) {
      *(undefined4 *)&(us->super_Replaceable).super_UObject._vptr_UObject = 8;
      t_local._4_4_ = 0;
    }
    else {
      if (limit_local < limit32) {
        local_70 = icu_63::UnicodeString::getChar32Start(_start32,(int32_t)limit_local);
      }
      else {
        local_70 = limit32;
      }
      trimmedLength = local_70;
      if ((long)dest_local < (long)limit32) {
        local_74 = icu_63::UnicodeString::getChar32Start(_start32,(int32_t)dest_local);
      }
      else {
        local_74 = limit32;
      }
      this = _start32;
      start_00 = trimmedLength;
      local_54 = local_74;
      limit32 = local_74 - trimmedLength;
      if ((pErrorCode_local._4_4_ < 1) || (pUStack_30 == (char16_t *)0x0)) {
        *(int32_t *)(start_local + 0x28) = trimmedLength;
      }
      else {
        local_58 = limit32;
        if (pErrorCode_local._4_4_ < limit32) {
          local_58 = pErrorCode_local._4_4_;
        }
        _length = local_58;
        icu_63::Char16Ptr::Char16Ptr(&local_60,pUStack_30);
        icu_63::UnicodeString::extract(this,start_00,_length,&local_60,0);
        icu_63::Char16Ptr::~Char16Ptr(&local_60);
        *(int32_t *)(start_local + 0x28) = trimmedLength + local_58;
      }
      u_terminateUChars_63(pUStack_30,pErrorCode_local._4_4_,limit32,(UErrorCode *)us);
      t_local._4_4_ = limit32;
    }
  }
  else {
    t_local._4_4_ = 0;
  }
  return t_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
unistrTextExtract(UText *t,
                  int64_t start, int64_t limit,
                  UChar *dest, int32_t destCapacity,
                  UErrorCode *pErrorCode) {
    const UnicodeString *us=(const UnicodeString *)t->context;
    int32_t length=us->length();

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    }
    if(start<0 || start>limit) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    int32_t start32 = start<length ? us->getChar32Start((int32_t)start) : length;
    int32_t limit32 = limit<length ? us->getChar32Start((int32_t)limit) : length;

    length=limit32-start32;
    if (destCapacity>0 && dest!=NULL) {
        int32_t trimmedLength = length;
        if(trimmedLength>destCapacity) {
            trimmedLength=destCapacity;
        }
        us->extract(start32, trimmedLength, dest);
        t->chunkOffset = start32+trimmedLength;
    } else {
        t->chunkOffset = start32;
    }
    u_terminateUChars(dest, destCapacity, length, pErrorCode);
    return length;
}